

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

void __thiscall re2::PCRE::~PCRE(PCRE *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->error_;
  if (psVar1 != (string *)0x0 && psVar1 != (string *)empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  pcVar2 = (this->pattern_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->pattern_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

PCRE::~PCRE() {
  if (re_full_ != NULL)         pcre_free(re_full_);
  if (re_partial_ != NULL)      pcre_free(re_partial_);
  if (error_ != &empty_string)  delete error_;
}